

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CreateIndex(Parse *pParse,Token *pName1,Token *pName2,SrcList *pTblName,ExprList *pList,
                       int onError,Token *pStart,Expr *pPIWhere,int sortOrder,int ifNotExist,
                       u8 idxType)

{
  byte *pbVar1;
  byte bVar2;
  u16 uVar3;
  short sVar4;
  ushort uVar5;
  sqlite3 *db;
  i16 *piVar6;
  i16 *piVar7;
  u8 uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  Table *pTVar14;
  char *zName;
  Index *pIVar15;
  Table *pTVar16;
  Expr *pEVar17;
  size_t sVar18;
  ExprList *pEVar19;
  Expr *pEVar20;
  CollSeq *pCVar21;
  ulong uVar22;
  void *pvVar23;
  Index *pIVar24;
  Index *pIVar25;
  long lVar26;
  ExprList_item *pEVar27;
  Op *pOVar28;
  Schema **ppSVar29;
  char *pcVar30;
  char *pcVar31;
  Token *pName_00;
  uchar uVar32;
  uchar uVar33;
  short *psVar34;
  ulong uVar35;
  long lVar36;
  Db *pDVar37;
  ExprList *local_e8;
  Vdbe *local_e0;
  ExprList_item *local_d0;
  char *local_c0;
  char *local_b0;
  char *zExtra;
  long local_88;
  char *local_80;
  Token *pName;
  Token prevCol;
  DbFixer sFix;
  
  db = pParse->db;
  pName = (Token *)0x0;
  zExtra = (char *)0x0;
  local_e8 = pList;
  zName = (char *)0x0;
  if (db->mallocFailed == '\0') {
    if ((pParse->nErr < 1) && ((idxType == '\x02' || (pParse->declareVtab == '\0')))) {
      iVar9 = sqlite3ReadSchema(pParse);
      if (iVar9 != 0) goto LAB_0014cf35;
      if (pTblName != (SrcList *)0x0) {
        uVar10 = sqlite3TwoPartName(pParse,pName1,pName2,&pName);
        if ((int)uVar10 < 0) goto LAB_0014cf35;
        uVar35 = (ulong)uVar10;
        if ((((db->init).busy == '\0') &&
            (pTVar14 = sqlite3SrcListLookup(pParse,pTblName),
            pTVar14 != (Table *)0x0 && pName2->n == 0)) && (pTVar14->pSchema == db->aDb[1].pSchema))
        {
          uVar35 = 1;
        }
        pName_00 = pName;
        pDVar37 = pParse->db->aDb;
        sFix.zDb = pDVar37[uVar35].zDbSName;
        sFix.pSchema = pDVar37[uVar35].pSchema;
        sFix.zType = "index";
        sFix.pName = pName;
        sFix.bVarOnly = (int)((int)uVar35 == 1);
        sFix.pParse = pParse;
        sqlite3FixSrcList(&sFix,pTblName);
        pTVar14 = sqlite3LocateTableItem(pParse,0,pTblName->a);
        zName = (char *)0x0;
        if (pTVar14 == (Table *)0x0) goto LAB_0014ceca;
        if (((int)uVar35 != 1) || (db->aDb[1].pSchema == pTVar14->pSchema)) {
          if ((pTVar14->tabFlags & 0x20) == 0) {
            pIVar25 = (Index *)0x0;
            goto LAB_0014d0b7;
          }
          for (pIVar25 = pTVar14->pIndex; pIVar25 != (Index *)0x0; pIVar25 = pIVar25->pNext) {
            if ((pIVar25->field_0x63 & 3) == 2) goto LAB_0014d0b7;
          }
          goto LAB_0014d0b4;
        }
        zName = pTVar14->zName;
        pcVar31 = "cannot create a TEMP index on non-TEMP table \"%s\"";
LAB_0014d267:
        pcVar30 = (char *)0x0;
        goto LAB_0014d26d;
      }
      pTVar14 = pParse->pNewTable;
      if (pTVar14 == (Table *)0x0) goto LAB_0014cf35;
      uVar35 = 0;
      if (pTVar14->pSchema == (Schema *)0x0) {
        uVar35 = 0xfff0bdc0;
LAB_0014d0b2:
        pName_00 = (Token *)0x0;
LAB_0014d0b4:
        pIVar25 = (Index *)0x0;
      }
      else {
        uVar10 = db->nDb;
        if ((int)uVar10 < 1) goto LAB_0014d0b2;
        ppSVar29 = &db->aDb->pSchema;
        uVar35 = 0;
        do {
          if (*ppSVar29 == pTVar14->pSchema) goto LAB_0014d0b2;
          uVar35 = uVar35 + 1;
          ppSVar29 = ppSVar29 + 4;
        } while (uVar10 != uVar35);
        pName_00 = (Token *)0x0;
        pIVar25 = (Index *)0x0;
        uVar35 = (ulong)uVar10;
      }
LAB_0014d0b7:
      iVar9 = (int)uVar35;
      lVar36 = (long)iVar9 * 0x20;
      pDVar37 = db->aDb + iVar9;
      zName = pTVar14->zName;
      if (zName != (char *)0x0) {
        lVar26 = 0;
        do {
          if ((ulong)(byte)zName[lVar26] == 0) {
            uVar33 = ""[(byte)"sqlite_"[lVar26]];
            uVar32 = '\0';
LAB_0014d10e:
            if (uVar32 != uVar33) goto LAB_0014d11f;
            break;
          }
          uVar32 = ""[(byte)zName[lVar26]];
          uVar33 = ""[(byte)"sqlite_"[lVar26]];
          if (uVar32 != uVar33) goto LAB_0014d10e;
          lVar26 = lVar26 + 1;
        } while (lVar26 != 7);
        if ((db->init).busy == '\0') {
          lVar26 = 0;
          do {
            if ((ulong)(byte)zName[lVar26 + 7] == 0) {
              uVar33 = ""[(byte)"altertab_"[lVar26]];
              uVar32 = '\0';
LAB_0014d254:
              if (uVar32 != uVar33) {
                pcVar31 = "table %s may not be indexed";
                goto LAB_0014d267;
              }
              break;
            }
            uVar32 = ""[(byte)zName[lVar26 + 7]];
            uVar33 = ""[(byte)"altertab_"[lVar26]];
            if (uVar32 != uVar33) goto LAB_0014d254;
            lVar26 = lVar26 + 1;
          } while (lVar26 != 9);
        }
      }
LAB_0014d11f:
      if (pTVar14->pSelect == (Select *)0x0) {
        if (pTVar14->nModuleArg == 0) {
          local_88 = lVar36;
          if (pName_00 == (Token *)0x0) {
            for (pIVar15 = pTVar14->pIndex; pIVar15 != (Index *)0x0; pIVar15 = pIVar15->pNext) {
            }
            zName = sqlite3MPrintf(db,"sqlite_autoindex_%s_%d");
            if (zName != (char *)0x0) {
              if (pParse->declareVtab != '\0') {
                zName[7] = zName[7] + '\x01';
              }
LAB_0014d2bb:
              pcVar31 = pDVar37->zDbSName;
              pcVar30 = "sqlite_master";
              if (iVar9 == 1) {
                pcVar30 = "sqlite_temp_master";
              }
              iVar11 = sqlite3AuthCheck(pParse,0x12,pcVar30,(char *)0x0,pcVar31);
              if ((iVar11 == 0) &&
                 (iVar11 = sqlite3AuthCheck(pParse,(uint)(iVar9 == 1) * 2 + 1,zName,pTVar14->zName,
                                            pcVar31), iVar11 == 0)) {
                if (pList == (ExprList *)0x0) {
                  prevCol.z = pTVar14->aCol[(long)pTVar14->nCol + -1].zName;
                  if (prevCol.z == (char *)0x0) {
                    prevCol.n = 0;
                  }
                  else {
                    sVar18 = strlen(prevCol.z);
                    prevCol.n = (uint)sVar18 & 0x3fffffff;
                  }
                  pEVar17 = sqlite3ExprAlloc(db,0x1b,&prevCol,0);
                  local_e8 = sqlite3ExprListAppend((Parse *)pParse->db,(ExprList *)0x0,pEVar17);
                  if (local_e8 != (ExprList *)0x0) {
                    if (-1 < sortOrder) {
                      local_e8->a[(long)local_e8->nExpr + -1].sortOrder = (u8)sortOrder;
                    }
                    goto LAB_0014d414;
                  }
                  local_e8 = (ExprList *)0x0;
                }
                else {
                  uVar10 = pList->nExpr;
                  if (pParse->db->aLimit[2] < (int)uVar10) {
                    sqlite3ErrorMsg(pParse,"too many columns in %s","index");
LAB_0014d414:
                    uVar10 = local_e8->nExpr;
                  }
                  uVar3 = 1;
                  iVar11 = 1;
                  if (0 < (int)uVar10) {
                    lVar36 = 0;
                    iVar11 = 0;
                    do {
                      pcVar31 = *(char **)((long)&local_e8->a[0].pExpr + lVar36);
                      if (*pcVar31 == '^') {
                        pcVar31 = *(char **)(pcVar31 + 8);
                        if (pcVar31 == (char *)0x0) {
                          iVar12 = 1;
                        }
                        else {
                          sVar18 = strlen(pcVar31);
                          iVar12 = ((uint)sVar18 & 0x3fffffff) + 1;
                        }
                        iVar11 = iVar11 + iVar12;
                      }
                      lVar36 = lVar36 + 0x20;
                    } while ((ulong)uVar10 << 5 != lVar36);
                    iVar11 = iVar11 + 1;
                  }
                  sVar18 = strlen(zName);
                  uVar13 = (uint)sVar18 & 0x3fffffff;
                  if (pIVar25 != (Index *)0x0) {
                    uVar3 = pIVar25->nKeyCol;
                  }
                  pIVar15 = sqlite3AllocateIndexObject
                                      (db,uVar3 + (short)uVar10,iVar11 + uVar13,&zExtra);
                  pcVar31 = zExtra;
                  if (db->mallocFailed == '\0') {
                    pIVar15->zName = zExtra;
                    local_b0 = zExtra + (ulong)uVar13 + 1;
                    zExtra = local_b0;
                    memcpy(pcVar31,zName,(ulong)uVar13 + 1);
                    pIVar15->pTable = pTVar14;
                    pIVar15->onError = (u8)onError;
                    pIVar15->field_0x63 =
                         idxType & 3 | (onError != 0) << 3 | pIVar15->field_0x63 & 0xf4;
                    pIVar15->pSchema = *(Schema **)((long)&db->aDb->pSchema + local_88);
                    iVar11 = local_e8->nExpr;
                    pIVar15->nKeyCol = (u16)iVar11;
                    if (pPIWhere != (Expr *)0x0) {
                      sqlite3ResolveSelfReference(pParse,pTVar14,2,pPIWhere,(ExprList *)0x0);
                      pIVar15->pPartIdxWhere = pPIWhere;
                      iVar11 = local_e8->nExpr;
                    }
                    if (iVar11 < 1) {
                      local_e0 = (Vdbe *)0x0;
                    }
                    else {
                      bVar2 = pDVar37->pSchema->file_format;
                      local_d0 = local_e8->a;
                      pPIWhere = (Expr *)0x0;
                      local_e0 = (Vdbe *)0x0;
                      do {
                        pEVar17 = local_d0->pExpr;
                        pEVar20 = pEVar17;
                        if ((pEVar17->op == 'a') ||
                           ((pEVar17->op == '^' && (pEVar20 = pEVar17->pLeft, pEVar20->op == 'a'))))
                        {
                          pEVar20->op = '\x1b';
                        }
                        sqlite3ResolveSelfReference(pParse,pTVar14,0x20,pEVar17,(ExprList *)0x0);
                        if (pParse->nErr != 0) goto LAB_0014dd6c;
                        pEVar20 = local_d0->pExpr;
                        uVar10 = pEVar20->flags;
                        pEVar17 = pEVar20;
                        while ((uVar10 >> 0xc & 1) != 0) {
                          if ((uVar10 >> 0x12 & 1) == 0) {
                            pEVar27 = (ExprList_item *)&pEVar17->pLeft;
                          }
                          else {
                            pEVar27 = ((pEVar17->x).pList)->a;
                          }
                          pEVar17 = pEVar27->pExpr;
                          uVar10 = pEVar17->flags;
                        }
                        if (pEVar17->op == 0x98) {
                          uVar10 = (uint)pEVar17->iColumn;
                          if (pEVar17->iColumn < 0) {
                            uVar10 = (uint)pTVar14->iPKey;
                          }
                          else if (pTVar14->aCol[uVar10].notNull == '\0') {
                            pIVar15->field_0x63 = pIVar15->field_0x63 & 0xf7;
                            pEVar20 = local_d0->pExpr;
                          }
                          pIVar15->aiColumn[(long)local_e0] = (i16)uVar10;
                          if (pEVar20->op == '^') goto LAB_0014d718;
                          if ((int)uVar10 < 0) {
LAB_0014d75e:
                            local_c0 = local_b0;
                            local_b0 = (char *)0x0;
                          }
                          else {
                            local_c0 = local_b0;
                            local_b0 = pTVar14->aCol[uVar10].zColl;
                          }
                        }
                        else {
                          if (pTVar14 == pParse->pNewTable) {
                            pPIWhere = (Expr *)0x0;
                            sqlite3ErrorMsg(pParse,
                                            "expressions prohibited in PRIMARY KEY and UNIQUE constraints"
                                           );
                            goto LAB_0014d4dd;
                          }
                          if (pIVar15->aColExpr == (ExprList *)0x0) {
                            pEVar19 = sqlite3ExprListDup(db,local_e8,0);
                            pIVar15->aColExpr = pEVar19;
                            if (db->mallocFailed == '\0') {
                              local_d0 = pEVar19->a + (long)local_e0;
                            }
                          }
                          pIVar15->aiColumn[(long)local_e0] = -2;
                          pIVar15->field_0x63 = pIVar15->field_0x63 & 0xf7;
                          pEVar20 = local_d0->pExpr;
                          if (pEVar20->op != '^') goto LAB_0014d75e;
LAB_0014d718:
                          local_80 = (pEVar20->u).zToken;
                          if (local_80 == (char *)0x0) {
                            sVar18 = 1;
                          }
                          else {
                            sVar18 = strlen(local_80);
                            sVar18 = (ulong)((uint)sVar18 & 0x3fffffff) + 1;
                          }
                          memcpy(local_b0,local_80,sVar18);
                          local_c0 = local_b0 + sVar18;
                          zExtra = local_c0;
                        }
                        if (local_b0 == (char *)0x0) {
                          local_b0 = "BINARY";
                        }
                        if (((db->init).busy == '\0') &&
                           (pCVar21 = sqlite3LocateCollSeq(pParse,local_b0),
                           pCVar21 == (CollSeq *)0x0)) goto LAB_0014dd6c;
                        uVar8 = '\0';
                        pIVar15->azColl[(long)local_e0] = local_b0;
                        if (3 < bVar2) {
                          uVar8 = (u8)*(undefined4 *)&local_d0->sortOrder;
                        }
                        pIVar15->aSortOrder[(long)local_e0] = uVar8;
                        local_e0 = (Vdbe *)((long)local_e0 + 1);
                        local_d0 = local_d0 + 1;
                        local_b0 = local_c0;
                      } while ((long)local_e0 < (long)local_e8->nExpr);
                    }
                    if (pIVar25 == (Index *)0x0) {
                      pIVar15->aiColumn[(ulong)local_e0 & 0xffffffff] = -1;
                      pIVar15->azColl[(ulong)local_e0 & 0xffffffff] = "BINARY";
                    }
                    else {
                      uVar35 = (ulong)pIVar25->nKeyCol;
                      if (pIVar25->nKeyCol != 0) {
                        uVar22 = 0;
                        do {
                          uVar10 = (uint)pIVar15->nKeyCol;
                          psVar34 = pIVar15->aiColumn;
                          do {
                            if ((int)uVar10 < 1) {
                              iVar11 = (int)local_e0;
                              pIVar15->aiColumn[iVar11] = pIVar25->aiColumn[uVar22];
                              pIVar15->azColl[iVar11] = pIVar25->azColl[uVar22];
                              pIVar15->aSortOrder[iVar11] = pIVar25->aSortOrder[uVar22];
                              local_e0 = (Vdbe *)(ulong)(iVar11 + 1);
                              uVar35 = (ulong)pIVar25->nKeyCol;
                              goto LAB_0014d8c6;
                            }
                            uVar10 = uVar10 - 1;
                            sVar4 = *psVar34;
                            psVar34 = psVar34 + 1;
                          } while (sVar4 != pIVar25->aiColumn[uVar22]);
                          pIVar15->nColumn = pIVar15->nColumn - 1;
LAB_0014d8c6:
                          uVar22 = uVar22 + 1;
                        } while (uVar22 < uVar35);
                      }
                    }
                    sqlite3DefaultRowEst(pIVar15);
                    if (pParse->pNewTable == (Table *)0x0) {
                      estimateIndexWidth(pIVar15);
                    }
                    if ((pTblName != (SrcList *)0x0) &&
                       (uVar5 = pIVar15->nColumn, (int)pTVar14->nCol <= (int)(uint)uVar5)) {
                      bVar2 = pIVar15->field_0x63;
                      pIVar15->field_0x63 = bVar2 | 0x20;
                      if (0 < pTVar14->nCol) {
                        iVar11 = 0;
                        do {
                          if (iVar11 != pTVar14->iPKey) {
                            if ((ulong)uVar5 != 0) {
                              uVar35 = 0;
                              while (pIVar15->aiColumn[uVar35] != (short)iVar11) {
                                uVar35 = uVar35 + 1;
                                if (uVar5 == uVar35) goto LAB_0014d9a9;
                              }
                              if (-1 < (short)uVar35) goto LAB_0014d989;
                            }
LAB_0014d9a9:
                            pIVar15->field_0x63 = bVar2 & 0xdf;
                            break;
                          }
LAB_0014d989:
                          iVar11 = iVar11 + 1;
                        } while (iVar11 != pTVar14->nCol);
                      }
                    }
                    if ((pTVar14 == pParse->pNewTable) &&
                       (pIVar25 = pTVar14->pIndex, pIVar25 != (Index *)0x0)) {
                      uVar5 = pIVar15->nKeyCol;
                      do {
                        if (pIVar25->nKeyCol == uVar5) {
                          if ((ulong)uVar5 == 0) {
                            uVar35 = 0;
                          }
                          else {
                            piVar6 = pIVar25->aiColumn;
                            piVar7 = pIVar15->aiColumn;
                            uVar35 = 0;
                            while ((piVar6[uVar35] == piVar7[uVar35] &&
                                   (iVar11 = sqlite3StrICmp(pIVar25->azColl[uVar35],
                                                            pIVar15->azColl[uVar35]), iVar11 == 0)))
                            {
                              uVar35 = uVar35 + 1;
                              if (uVar5 == uVar35) goto LAB_0014dcda;
                            }
                          }
                          local_e0._0_4_ = (uint)uVar5;
                          if ((uint)uVar35 == (uint)local_e0) {
LAB_0014dcda:
                            uVar8 = pIVar25->onError;
                            if (uVar8 != pIVar15->onError) {
                              if ((uVar8 != '\n') && (pIVar15->onError != '\n')) {
                                sqlite3ErrorMsg(pParse,"conflicting ON CONFLICT clauses specified",0
                                               );
                                uVar8 = pIVar25->onError;
                              }
                              if (uVar8 == '\n') {
                                pIVar25->onError = pIVar15->onError;
                              }
                            }
                            if (idxType == '\x02') {
                              pIVar25->field_0x63 = pIVar25->field_0x63 & 0xfc | 2;
                            }
                            goto LAB_0014dd6a;
                          }
                        }
                        pIVar25 = pIVar25->pNext;
                      } while (pIVar25 != (Index *)0x0);
                    }
                    if ((db->init).busy == '\0') {
                      if ((pTblName == (SrcList *)0x0) && ((pTVar14->tabFlags & 0x20) != 0))
                      goto LAB_0014dd7e;
                      uVar10 = pParse->nMem + 1;
                      pParse->nMem = uVar10;
                      local_e0 = pParse->pVdbe;
                      if ((local_e0 != (Vdbe *)0x0) ||
                         (local_e0 = allocVdbe(pParse), local_e0 != (Vdbe *)0x0)) {
                        sqlite3BeginWriteOperation(pParse,1,iVar9);
                        pcVar31 = (char *)0x0;
                        iVar11 = sqlite3VdbeAddOp3(local_e0,0xa6,0,0,0);
                        pIVar15->tnum = iVar11;
                        sqlite3VdbeAddOp3(local_e0,0x86,iVar9,uVar10,0);
                        if (pStart != (Token *)0x0) {
                          iVar11 = (*(int *)&(pParse->sLastToken).z - (int)pName_00->z) +
                                   (pParse->sLastToken).n;
                          pcVar31 = " UNIQUE";
                          if (onError == 0) {
                            pcVar31 = "";
                          }
                          pcVar31 = sqlite3MPrintf(db,"CREATE%s INDEX %.*s",pcVar31,
                                                   (ulong)(iVar11 - (uint)(pName_00->z
                                                                           [(long)iVar11 + -1] ==
                                                                          ';')));
                        }
                        sqlite3NestedParse(pParse,
                                           "INSERT INTO %Q.%s VALUES(\'index\',%Q,%Q,#%d,%Q);",
                                           *(undefined8 *)((long)&db->aDb->zDbSName + local_88),
                                           "sqlite_master",pIVar15->zName,pTVar14->zName,
                                           (ulong)uVar10,pcVar31);
                        if (pcVar31 != (char *)0x0) {
                          sqlite3DbFreeNN(db,pcVar31);
                        }
                        if (pTblName != (SrcList *)0x0) {
                          sqlite3RefillIndex(pParse,pIVar15,uVar10);
                          sqlite3VdbeAddOp3(pParse->pVdbe,0x66,iVar9,1,
                                            **(int **)((long)&pParse->db->aDb->pSchema + local_88) +
                                            1);
                          pcVar31 = sqlite3MPrintf(db,"name=\'%q\' AND type=\'index\'",
                                                   pIVar15->zName);
                          sqlite3VdbeAddParseSchemaOp(local_e0,iVar9,pcVar31);
                          sqlite3VdbeAddOp3(local_e0,0x97,0,0,0);
                        }
                        if (local_e0->db->mallocFailed == '\0') {
                          iVar9 = local_e0->nOp + -1;
                          if (-1 < pIVar15->tnum) {
                            iVar9 = pIVar15->tnum;
                          }
                          pOVar28 = local_e0->aOp + iVar9;
                        }
                        else {
                          pOVar28 = (Op *)&sqlite3VdbeGetOp_dummy;
                        }
                        pOVar28->p2 = local_e0->nOp;
                        goto LAB_0014dd59;
                      }
                      pPIWhere = (Expr *)0x0;
                      goto LAB_0014d4dd;
                    }
                    pvVar23 = sqlite3HashInsert(&pIVar15->pSchema->idxHash,pIVar15->zName,pIVar15);
                    if (pvVar23 == (void *)0x0) {
                      pbVar1 = (byte *)((long)&db->flags + 2);
                      *pbVar1 = *pbVar1 | 0x80;
                      if (pTblName != (SrcList *)0x0) {
                        pIVar15->tnum = (db->init).newTnum;
LAB_0014dd59:
                        if ((pTblName != (SrcList *)0x0) && ((db->init).busy == '\0'))
                        goto LAB_0014dd6a;
                      }
LAB_0014dd7e:
                      pIVar25 = pTVar14->pIndex;
                      if (onError == 5) {
                        if (pIVar25 == (Index *)0x0) {
                          pIVar25 = (Index *)0x0;
                        }
                        else if (pIVar25->onError != '\x05') {
                          do {
                            pIVar24 = pIVar25;
                            pIVar25 = pIVar24->pNext;
                            if (pIVar25 == (Index *)0x0) break;
                          } while (pIVar25->onError != '\x05');
                          pIVar15->pNext = pIVar25;
                          pIVar24->pNext = pIVar15;
                          goto LAB_0014cee0;
                        }
                      }
                      pIVar15->pNext = pIVar25;
                      pTVar14->pIndex = pIVar15;
                      goto LAB_0014cee0;
                    }
                    if ((db->mallocFailed == '\0') && (db->bBenignMalloc == '\0')) {
                      db->mallocFailed = '\x01';
                      if (0 < db->nVdbeExec) {
                        (db->u1).isInterrupted = 1;
                      }
                      (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
                    }
LAB_0014dd6a:
                    pPIWhere = (Expr *)0x0;
                  }
                  else {
LAB_0014d4dd:
                    if (pIVar15 == (Index *)0x0) goto LAB_0014ceca;
                  }
LAB_0014dd6c:
                  freeIndex(db,pIVar15);
                }
              }
              goto LAB_0014ceca;
            }
          }
          else {
            zName = sqlite3NameFromToken(db,pName_00);
            if (zName != (char *)0x0) {
              iVar11 = sqlite3CheckObjectName(pParse,zName);
              if (iVar11 == 0) {
                pcVar30 = zName;
                if (((db->init).busy == '\0') &&
                   (pTVar16 = sqlite3FindTable(db,zName,(char *)0x0), pTVar16 != (Table *)0x0)) {
                  pcVar31 = "there is already a table named %s";
                }
                else {
                  pIVar15 = sqlite3FindIndex(db,zName,pDVar37->zDbSName);
                  if (pIVar15 == (Index *)0x0) goto LAB_0014d2bb;
                  if (ifNotExist != 0) {
                    sqlite3CodeVerifySchema(pParse,iVar9);
                    goto LAB_0014ceca;
                  }
                  pcVar31 = "index %s already exists";
                }
LAB_0014d26d:
                sqlite3ErrorMsg(pParse,pcVar31,zName);
                zName = pcVar30;
              }
              goto LAB_0014ceca;
            }
          }
LAB_0014cf35:
          zName = (char *)0x0;
          goto LAB_0014ceca;
        }
        pcVar31 = "virtual tables may not be indexed";
      }
      else {
        pcVar31 = "views may not be indexed";
      }
      zName = (char *)0x0;
      sqlite3ErrorMsg(pParse,pcVar31);
    }
    else {
      zName = (char *)0x0;
    }
  }
LAB_0014ceca:
  if (pPIWhere != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pPIWhere);
  }
LAB_0014cee0:
  if (local_e8 != (ExprList *)0x0) {
    exprListDeleteNN(db,local_e8);
  }
  sqlite3SrcListDelete(db,pTblName);
  if (zName != (char *)0x0) {
    sqlite3DbFreeNN(db,zName);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateIndex(
  Parse *pParse,     /* All information about this parse */
  Token *pName1,     /* First part of index name. May be NULL */
  Token *pName2,     /* Second part of index name. May be NULL */
  SrcList *pTblName, /* Table to index. Use pParse->pNewTable if 0 */
  ExprList *pList,   /* A list of columns to be indexed */
  int onError,       /* OE_Abort, OE_Ignore, OE_Replace, or OE_None */
  Token *pStart,     /* The CREATE token that begins this statement */
  Expr *pPIWhere,    /* WHERE clause for partial indices */
  int sortOrder,     /* Sort order of primary key when pList==NULL */
  int ifNotExist,    /* Omit error if index already exists */
  u8 idxType         /* The index type */
){
  Table *pTab = 0;     /* Table to be indexed */
  Index *pIndex = 0;   /* The index to be created */
  char *zName = 0;     /* Name of the index */
  int nName;           /* Number of characters in zName */
  int i, j;
  DbFixer sFix;        /* For assigning database names to pTable */
  int sortOrderMask;   /* 1 to honor DESC in index.  0 to ignore. */
  sqlite3 *db = pParse->db;
  Db *pDb;             /* The specific table containing the indexed database */
  int iDb;             /* Index of the database that is being written */
  Token *pName = 0;    /* Unqualified name of the index to create */
  struct ExprList_item *pListItem; /* For looping over pList */
  int nExtra = 0;                  /* Space allocated for zExtra[] */
  int nExtraCol;                   /* Number of extra columns needed */
  char *zExtra = 0;                /* Extra space after the Index object */
  Index *pPk = 0;      /* PRIMARY KEY index for WITHOUT ROWID tables */

  if( db->mallocFailed || pParse->nErr>0 ){
    goto exit_create_index;
  }
  if( IN_DECLARE_VTAB && idxType!=SQLITE_IDXTYPE_PRIMARYKEY ){
    goto exit_create_index;
  }
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto exit_create_index;
  }

  /*
  ** Find the table that is to be indexed.  Return early if not found.
  */
  if( pTblName!=0 ){

    /* Use the two-part index name to determine the database 
    ** to search for the table. 'Fix' the table name to this db
    ** before looking up the table.
    */
    assert( pName1 && pName2 );
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ) goto exit_create_index;
    assert( pName && pName->z );

#ifndef SQLITE_OMIT_TEMPDB
    /* If the index name was unqualified, check if the table
    ** is a temp table. If so, set the database to 1. Do not do this
    ** if initialising a database schema.
    */
    if( !db->init.busy ){
      pTab = sqlite3SrcListLookup(pParse, pTblName);
      if( pName2->n==0 && pTab && pTab->pSchema==db->aDb[1].pSchema ){
        iDb = 1;
      }
    }
#endif

    sqlite3FixInit(&sFix, pParse, iDb, "index", pName);
    if( sqlite3FixSrcList(&sFix, pTblName) ){
      /* Because the parser constructs pTblName from a single identifier,
      ** sqlite3FixSrcList can never fail. */
      assert(0);
    }
    pTab = sqlite3LocateTableItem(pParse, 0, &pTblName->a[0]);
    assert( db->mallocFailed==0 || pTab==0 );
    if( pTab==0 ) goto exit_create_index;
    if( iDb==1 && db->aDb[iDb].pSchema!=pTab->pSchema ){
      sqlite3ErrorMsg(pParse, 
           "cannot create a TEMP index on non-TEMP table \"%s\"",
           pTab->zName);
      goto exit_create_index;
    }
    if( !HasRowid(pTab) ) pPk = sqlite3PrimaryKeyIndex(pTab);
  }else{
    assert( pName==0 );
    assert( pStart==0 );
    pTab = pParse->pNewTable;
    if( !pTab ) goto exit_create_index;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  }
  pDb = &db->aDb[iDb];

  assert( pTab!=0 );
  assert( pParse->nErr==0 );
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 
       && db->init.busy==0
#if SQLITE_USER_AUTHENTICATION
       && sqlite3UserAuthTable(pTab->zName)==0
#endif
       && sqlite3StrNICmp(&pTab->zName[7],"altertab_",9)!=0 ){
    sqlite3ErrorMsg(pParse, "table %s may not be indexed", pTab->zName);
    goto exit_create_index;
  }
#ifndef SQLITE_OMIT_VIEW
  if( pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "views may not be indexed");
    goto exit_create_index;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be indexed");
    goto exit_create_index;
  }
#endif

  /*
  ** Find the name of the index.  Make sure there is not already another
  ** index or table with the same name.  
  **
  ** Exception:  If we are reading the names of permanent indices from the
  ** sqlite_master table (because some other process changed the schema) and
  ** one of the index names collides with the name of a temporary table or
  ** index, then we will continue to process this index.
  **
  ** If pName==0 it means that we are
  ** dealing with a primary key or UNIQUE constraint.  We have to invent our
  ** own name.
  */
  if( pName ){
    zName = sqlite3NameFromToken(db, pName);
    if( zName==0 ) goto exit_create_index;
    assert( pName->z!=0 );
    if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){
      goto exit_create_index;
    }
    if( !db->init.busy ){
      if( sqlite3FindTable(db, zName, 0)!=0 ){
        sqlite3ErrorMsg(pParse, "there is already a table named %s", zName);
        goto exit_create_index;
      }
    }
    if( sqlite3FindIndex(db, zName, pDb->zDbSName)!=0 ){
      if( !ifNotExist ){
        sqlite3ErrorMsg(pParse, "index %s already exists", zName);
      }else{
        assert( !db->init.busy );
        sqlite3CodeVerifySchema(pParse, iDb);
      }
      goto exit_create_index;
    }
  }else{
    int n;
    Index *pLoop;
    for(pLoop=pTab->pIndex, n=1; pLoop; pLoop=pLoop->pNext, n++){}
    zName = sqlite3MPrintf(db, "sqlite_autoindex_%s_%d", pTab->zName, n);
    if( zName==0 ){
      goto exit_create_index;
    }

    /* Automatic index names generated from within sqlite3_declare_vtab()
    ** must have names that are distinct from normal automatic index names.
    ** The following statement converts "sqlite3_autoindex..." into
    ** "sqlite3_butoindex..." in order to make the names distinct.
    ** The "vtab_err.test" test demonstrates the need of this statement. */
    if( IN_DECLARE_VTAB ) zName[7]++;
  }

  /* Check for authorization to create an index.
  */
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    const char *zDb = pDb->zDbSName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iDb), 0, zDb) ){
      goto exit_create_index;
    }
    i = SQLITE_CREATE_INDEX;
    if( !OMIT_TEMPDB && iDb==1 ) i = SQLITE_CREATE_TEMP_INDEX;
    if( sqlite3AuthCheck(pParse, i, zName, pTab->zName, zDb) ){
      goto exit_create_index;
    }
  }
#endif

  /* If pList==0, it means this routine was called to make a primary
  ** key out of the last column added to the table under construction.
  ** So create a fake list to simulate this.
  */
  if( pList==0 ){
    Token prevCol;
    sqlite3TokenInit(&prevCol, pTab->aCol[pTab->nCol-1].zName);
    pList = sqlite3ExprListAppend(pParse, 0,
              sqlite3ExprAlloc(db, TK_ID, &prevCol, 0));
    if( pList==0 ) goto exit_create_index;
    assert( pList->nExpr==1 );
    sqlite3ExprListSetSortOrder(pList, sortOrder);
  }else{
    sqlite3ExprListCheckLength(pParse, pList, "index");
  }

  /* Figure out how many bytes of space are required to store explicitly
  ** specified collation sequence names.
  */
  for(i=0; i<pList->nExpr; i++){
    Expr *pExpr = pList->a[i].pExpr;
    assert( pExpr!=0 );
    if( pExpr->op==TK_COLLATE ){
      nExtra += (1 + sqlite3Strlen30(pExpr->u.zToken));
    }
  }

  /* 
  ** Allocate the index structure. 
  */
  nName = sqlite3Strlen30(zName);
  nExtraCol = pPk ? pPk->nKeyCol : 1;
  pIndex = sqlite3AllocateIndexObject(db, pList->nExpr + nExtraCol,
                                      nName + nExtra + 1, &zExtra);
  if( db->mallocFailed ){
    goto exit_create_index;
  }
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->aiRowLogEst) );
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->azColl) );
  pIndex->zName = zExtra;
  zExtra += nName + 1;
  memcpy(pIndex->zName, zName, nName+1);
  pIndex->pTable = pTab;
  pIndex->onError = (u8)onError;
  pIndex->uniqNotNull = onError!=OE_None;
  pIndex->idxType = idxType;
  pIndex->pSchema = db->aDb[iDb].pSchema;
  pIndex->nKeyCol = pList->nExpr;
  if( pPIWhere ){
    sqlite3ResolveSelfReference(pParse, pTab, NC_PartIdx, pPIWhere, 0);
    pIndex->pPartIdxWhere = pPIWhere;
    pPIWhere = 0;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );

  /* Check to see if we should honor DESC requests on index columns
  */
  if( pDb->pSchema->file_format>=4 ){
    sortOrderMask = -1;   /* Honor DESC */
  }else{
    sortOrderMask = 0;    /* Ignore DESC */
  }

  /* Analyze the list of expressions that form the terms of the index and
  ** report any errors.  In the common case where the expression is exactly
  ** a table column, store that column in aiColumn[].  For general expressions,
  ** populate pIndex->aColExpr and store XN_EXPR (-2) in aiColumn[].
  **
  ** TODO: Issue a warning if two or more columns of the index are identical.
  ** TODO: Issue a warning if the table primary key is used as part of the
  ** index key.
  */
  for(i=0, pListItem=pList->a; i<pList->nExpr; i++, pListItem++){
    Expr *pCExpr;                  /* The i-th index expression */
    int requestedSortOrder;        /* ASC or DESC on the i-th expression */
    const char *zColl;             /* Collation sequence name */

    sqlite3StringToId(pListItem->pExpr);
    sqlite3ResolveSelfReference(pParse, pTab, NC_IdxExpr, pListItem->pExpr, 0);
    if( pParse->nErr ) goto exit_create_index;
    pCExpr = sqlite3ExprSkipCollate(pListItem->pExpr);
    if( pCExpr->op!=TK_COLUMN ){
      if( pTab==pParse->pNewTable ){
        sqlite3ErrorMsg(pParse, "expressions prohibited in PRIMARY KEY and "
                                "UNIQUE constraints");
        goto exit_create_index;
      }
      if( pIndex->aColExpr==0 ){
        ExprList *pCopy = sqlite3ExprListDup(db, pList, 0);
        pIndex->aColExpr = pCopy;
        if( !db->mallocFailed ){
          assert( pCopy!=0 );
          pListItem = &pCopy->a[i];
        }
      }
      j = XN_EXPR;
      pIndex->aiColumn[i] = XN_EXPR;
      pIndex->uniqNotNull = 0;
    }else{
      j = pCExpr->iColumn;
      assert( j<=0x7fff );
      if( j<0 ){
        j = pTab->iPKey;
      }else if( pTab->aCol[j].notNull==0 ){
        pIndex->uniqNotNull = 0;
      }
      pIndex->aiColumn[i] = (i16)j;
    }
    zColl = 0;
    if( pListItem->pExpr->op==TK_COLLATE ){
      int nColl;
      zColl = pListItem->pExpr->u.zToken;
      nColl = sqlite3Strlen30(zColl) + 1;
      assert( nExtra>=nColl );
      memcpy(zExtra, zColl, nColl);
      zColl = zExtra;
      zExtra += nColl;
      nExtra -= nColl;
    }else if( j>=0 ){
      zColl = pTab->aCol[j].zColl;
    }
    if( !zColl ) zColl = sqlite3StrBINARY;
    if( !db->init.busy && !sqlite3LocateCollSeq(pParse, zColl) ){
      goto exit_create_index;
    }
    pIndex->azColl[i] = zColl;
    requestedSortOrder = pListItem->sortOrder & sortOrderMask;
    pIndex->aSortOrder[i] = (u8)requestedSortOrder;
  }

  /* Append the table key to the end of the index.  For WITHOUT ROWID
  ** tables (when pPk!=0) this will be the declared PRIMARY KEY.  For
  ** normal tables (when pPk==0) this will be the rowid.
  */
  if( pPk ){
    for(j=0; j<pPk->nKeyCol; j++){
      int x = pPk->aiColumn[j];
      assert( x>=0 );
      if( hasColumn(pIndex->aiColumn, pIndex->nKeyCol, x) ){
        pIndex->nColumn--; 
      }else{
        pIndex->aiColumn[i] = x;
        pIndex->azColl[i] = pPk->azColl[j];
        pIndex->aSortOrder[i] = pPk->aSortOrder[j];
        i++;
      }
    }
    assert( i==pIndex->nColumn );
  }else{
    pIndex->aiColumn[i] = XN_ROWID;
    pIndex->azColl[i] = sqlite3StrBINARY;
  }
  sqlite3DefaultRowEst(pIndex);
  if( pParse->pNewTable==0 ) estimateIndexWidth(pIndex);

  /* If this index contains every column of its table, then mark
  ** it as a covering index */
  assert( HasRowid(pTab) 
      || pTab->iPKey<0 || sqlite3ColumnOfIndex(pIndex, pTab->iPKey)>=0 );
  if( pTblName!=0 && pIndex->nColumn>=pTab->nCol ){
    pIndex->isCovering = 1;
    for(j=0; j<pTab->nCol; j++){
      if( j==pTab->iPKey ) continue;
      if( sqlite3ColumnOfIndex(pIndex,j)>=0 ) continue;
      pIndex->isCovering = 0;
      break;
    }
  }

  if( pTab==pParse->pNewTable ){
    /* This routine has been called to create an automatic index as a
    ** result of a PRIMARY KEY or UNIQUE clause on a column definition, or
    ** a PRIMARY KEY or UNIQUE clause following the column definitions.
    ** i.e. one of:
    **
    ** CREATE TABLE t(x PRIMARY KEY, y);
    ** CREATE TABLE t(x, y, UNIQUE(x, y));
    **
    ** Either way, check to see if the table already has such an index. If
    ** so, don't bother creating this one. This only applies to
    ** automatically created indices. Users can do as they wish with
    ** explicit indices.
    **
    ** Two UNIQUE or PRIMARY KEY constraints are considered equivalent
    ** (and thus suppressing the second one) even if they have different
    ** sort orders.
    **
    ** If there are different collating sequences or if the columns of
    ** the constraint occur in different orders, then the constraints are
    ** considered distinct and both result in separate indices.
    */
    Index *pIdx;
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      int k;
      assert( IsUniqueIndex(pIdx) );
      assert( pIdx->idxType!=SQLITE_IDXTYPE_APPDEF );
      assert( IsUniqueIndex(pIndex) );

      if( pIdx->nKeyCol!=pIndex->nKeyCol ) continue;
      for(k=0; k<pIdx->nKeyCol; k++){
        const char *z1;
        const char *z2;
        assert( pIdx->aiColumn[k]>=0 );
        if( pIdx->aiColumn[k]!=pIndex->aiColumn[k] ) break;
        z1 = pIdx->azColl[k];
        z2 = pIndex->azColl[k];
        if( sqlite3StrICmp(z1, z2) ) break;
      }
      if( k==pIdx->nKeyCol ){
        if( pIdx->onError!=pIndex->onError ){
          /* This constraint creates the same index as a previous
          ** constraint specified somewhere in the CREATE TABLE statement.
          ** However the ON CONFLICT clauses are different. If both this 
          ** constraint and the previous equivalent constraint have explicit
          ** ON CONFLICT clauses this is an error. Otherwise, use the
          ** explicitly specified behavior for the index.
          */
          if( !(pIdx->onError==OE_Default || pIndex->onError==OE_Default) ){
            sqlite3ErrorMsg(pParse, 
                "conflicting ON CONFLICT clauses specified", 0);
          }
          if( pIdx->onError==OE_Default ){
            pIdx->onError = pIndex->onError;
          }
        }
        if( idxType==SQLITE_IDXTYPE_PRIMARYKEY ) pIdx->idxType = idxType;
        goto exit_create_index;
      }
    }
  }

  /* Link the new Index structure to its table and to the other
  ** in-memory database structures. 
  */
  assert( pParse->nErr==0 );
  if( db->init.busy ){
    Index *p;
    assert( !IN_DECLARE_VTAB );
    assert( sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
    p = sqlite3HashInsert(&pIndex->pSchema->idxHash, 
                          pIndex->zName, pIndex);
    if( p ){
      assert( p==pIndex );  /* Malloc must have failed */
      sqlite3OomFault(db);
      goto exit_create_index;
    }
    db->flags |= SQLITE_InternChanges;
    if( pTblName!=0 ){
      pIndex->tnum = db->init.newTnum;
    }
  }

  /* If this is the initial CREATE INDEX statement (or CREATE TABLE if the
  ** index is an implied index for a UNIQUE or PRIMARY KEY constraint) then
  ** emit code to allocate the index rootpage on disk and make an entry for
  ** the index in the sqlite_master table and populate the index with
  ** content.  But, do not do this if we are simply reading the sqlite_master
  ** table to parse the schema, or if this index is the PRIMARY KEY index
  ** of a WITHOUT ROWID table.
  **
  ** If pTblName==0 it means this index is generated as an implied PRIMARY KEY
  ** or UNIQUE index in a CREATE TABLE statement.  Since the table
  ** has just been created, it contains no data and the index initialization
  ** step can be skipped.
  */
  else if( HasRowid(pTab) || pTblName!=0 ){
    Vdbe *v;
    char *zStmt;
    int iMem = ++pParse->nMem;

    v = sqlite3GetVdbe(pParse);
    if( v==0 ) goto exit_create_index;

    sqlite3BeginWriteOperation(pParse, 1, iDb);

    /* Create the rootpage for the index using CreateIndex. But before
    ** doing so, code a Noop instruction and store its address in 
    ** Index.tnum. This is required in case this index is actually a 
    ** PRIMARY KEY and the table is actually a WITHOUT ROWID table. In 
    ** that case the convertToWithoutRowidTable() routine will replace
    ** the Noop with a Goto to jump over the VDBE code generated below. */
    pIndex->tnum = sqlite3VdbeAddOp0(v, OP_Noop);
    sqlite3VdbeAddOp2(v, OP_CreateIndex, iDb, iMem);

    /* Gather the complete text of the CREATE INDEX statement into
    ** the zStmt variable
    */
    if( pStart ){
      int n = (int)(pParse->sLastToken.z - pName->z) + pParse->sLastToken.n;
      if( pName->z[n-1]==';' ) n--;
      /* A named index with an explicit CREATE INDEX statement */
      zStmt = sqlite3MPrintf(db, "CREATE%s INDEX %.*s",
        onError==OE_None ? "" : " UNIQUE", n, pName->z);
    }else{
      /* An automatic index created by a PRIMARY KEY or UNIQUE constraint */
      /* zStmt = sqlite3MPrintf(""); */
      zStmt = 0;
    }

    /* Add an entry in sqlite_master for this index
    */
    sqlite3NestedParse(pParse, 
        "INSERT INTO %Q.%s VALUES('index',%Q,%Q,#%d,%Q);",
        db->aDb[iDb].zDbSName, MASTER_NAME,
        pIndex->zName,
        pTab->zName,
        iMem,
        zStmt
    );
    sqlite3DbFree(db, zStmt);

    /* Fill the index with data and reparse the schema. Code an OP_Expire
    ** to invalidate all pre-compiled statements.
    */
    if( pTblName ){
      sqlite3RefillIndex(pParse, pIndex, iMem);
      sqlite3ChangeCookie(pParse, iDb);
      sqlite3VdbeAddParseSchemaOp(v, iDb,
         sqlite3MPrintf(db, "name='%q' AND type='index'", pIndex->zName));
      sqlite3VdbeAddOp0(v, OP_Expire);
    }

    sqlite3VdbeJumpHere(v, pIndex->tnum);
  }

  /* When adding an index to the list of indices for a table, make
  ** sure all indices labeled OE_Replace come after all those labeled
  ** OE_Ignore.  This is necessary for the correct constraint check
  ** processing (in sqlite3GenerateConstraintChecks()) as part of
  ** UPDATE and INSERT statements.  
  */
  if( db->init.busy || pTblName==0 ){
    if( onError!=OE_Replace || pTab->pIndex==0
         || pTab->pIndex->onError==OE_Replace){
      pIndex->pNext = pTab->pIndex;
      pTab->pIndex = pIndex;
    }else{
      Index *pOther = pTab->pIndex;
      while( pOther->pNext && pOther->pNext->onError!=OE_Replace ){
        pOther = pOther->pNext;
      }
      pIndex->pNext = pOther->pNext;
      pOther->pNext = pIndex;
    }
    pIndex = 0;
  }

  /* Clean up before exiting */
exit_create_index:
  if( pIndex ) freeIndex(db, pIndex);
  sqlite3ExprDelete(db, pPIWhere);
  sqlite3ExprListDelete(db, pList);
  sqlite3SrcListDelete(db, pTblName);
  sqlite3DbFree(db, zName);
}